

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::dec_writer>
          *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar1;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar2;
  ulong uVar3;
  
  uVar3 = (ulong)spec->width_ - f->size_;
  if ((ulong)spec->width_ < f->size_ || uVar3 == 0) {
LAB_001e9dd4:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)f,(counting_iterator<char> *)this);
    return;
  }
  bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *)
           &spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    bVar2 = bVar1;
    if (uVar3 < 2) {
      bVar2 = SUB41(*(undefined4 *)(this + 8),0);
    }
    *(ulong *)this = *(long *)this + (uVar3 >> 1);
    this[8] = bVar2;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)f,(counting_iterator<char> *)this);
    uVar3 = uVar3 - (uVar3 >> 1);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      *(ulong *)this = *(long *)this + uVar3;
      this[8] = bVar1;
      goto LAB_001e9dd4;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)f,(counting_iterator<char> *)this);
  }
  *(ulong *)this = *(long *)this + uVar3;
  this[8] = bVar1;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }